

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EQGameScanner.h
# Opt level: O1

unsigned_long __thiscall
EQGameScanner::findEQStructureOffset<unsigned_long>
          (EQGameScanner *this,DWORD startAddress,size_t blockSize,PBYTE byteMask,PCHAR charMask,
          DWORD baseEQPointerAddress)

{
  size_t __n;
  PBYTE byteMask_00;
  long lVar1;
  unsigned_long uVar2;
  allocator<char> local_61;
  DWORD local_60;
  size_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_60 = baseEQPointerAddress;
  local_58 = blockSize;
  __n = strlen(charMask);
  byteMask_00 = (PBYTE)operator_new__(__n);
  memcpy(byteMask_00,byteMask,__n);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,charMask,&local_61);
  lVar1 = std::__cxx11::string::find_first_of((char *)local_50,0x105426,0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  *(DWORD *)(byteMask_00 + lVar1) = local_60;
  uVar2 = findEQPointerOffset<unsigned_long>(this,startAddress,local_58,byteMask_00,charMask);
  operator_delete__(byteMask_00);
  return uVar2;
}

Assistant:

T findEQStructureOffset(DWORD startAddress, std::size_t blockSize, const PBYTE byteMask, const PCHAR charMask, const DWORD baseEQPointerAddress)
    {
        // Create a new, editable, copy of byteMask.
        PBYTE newByteMask = new BYTE[strlen(charMask)];
        memcpy(newByteMask, byteMask, strlen(charMask));

        // Replace the EQPointer in our byteMask with the EQPointer given as an argument.
        // The location of the EQPointer is denoted by the letter o in our character mask.
        // Currently we require and always assume that the EQPointer is 4 bytes.
        PDWORD valueToChange = reinterpret_cast<PDWORD>(newByteMask + std::string(reinterpret_cast<const PCHAR>(charMask)).find_first_of("o"));
        *valueToChange = baseEQPointerAddress;

        // Use the updated byteMask to locate the EQStructureOffset
        T nRet = findEQPointerOffset<T>(startAddress, blockSize, newByteMask, charMask);
        delete[] newByteMask;

        return nRet;
    }